

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O0

void __thiscall wasm::SSAify::runOnFunction(SSAify *this,Module *module_,Function *func_)

{
  ReFinalize local_2b0;
  undefined1 local_138 [8];
  LocalGraph graph;
  Function *func__local;
  Module *module__local;
  SSAify *this_local;
  
  this->module = module_;
  this->func = func_;
  graph.getInfluences._M_h._M_single_bucket = (__node_base_ptr)func_;
  LocalGraph::LocalGraph((LocalGraph *)local_138,this->func,this->module);
  LocalGraph::computeSetInfluences((LocalGraph *)local_138);
  LocalGraph::computeSSAIndexes((LocalGraph *)local_138);
  createNewIndexes(this,(LocalGraph *)local_138);
  computeGetsAndPhis(this,(LocalGraph *)local_138);
  addPrepends(this);
  if ((this->refinalize & 1U) != 0) {
    ReFinalize::ReFinalize(&local_2b0);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_2b0.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               this->func,this->module);
    ReFinalize::~ReFinalize(&local_2b0);
  }
  LocalGraph::~LocalGraph((LocalGraph *)local_138);
  return;
}

Assistant:

void runOnFunction(Module* module_, Function* func_) override {
    module = module_;
    func = func_;
    LocalGraph graph(func, module);
    graph.computeSetInfluences();
    graph.computeSSAIndexes();
    // create new local indexes, one for each set
    createNewIndexes(graph);
    // we now know the sets for each get, and can compute get indexes and handle
    // phis
    computeGetsAndPhis(graph);
    // add prepends to function
    addPrepends();

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, module);
    }
  }